

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbd_standalone.cpp
# Opt level: O1

void __thiscall Intel_V4L2::getLRFrames(Intel_V4L2 *this,uchar *left_rect,uchar *right_rect)

{
  int *piVar1;
  undefined2 uVar2;
  int i_1;
  int iVar3;
  uchar *puVar4;
  int i;
  long lVar5;
  int j;
  long lVar6;
  uchar *puVar7;
  uchar *puVar8;
  Mat rightMat;
  Mat leftMat;
  Mat local_250 [16];
  long local_240;
  long *local_208;
  Mat local_1f0 [16];
  long local_1e0;
  long *local_1a8;
  long *local_190 [2];
  Mat local_180 [96];
  Mat local_120 [96];
  Mat local_c0 [144];
  
  iVar3 = capture_frame(this);
  if (iVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error : failed to capture Infrared frame.",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    return;
  }
  puVar4 = this->m_pBigBuffer;
  lVar5 = 0;
  puVar7 = left_rect;
  puVar8 = right_rect;
  do {
    lVar6 = 0;
    do {
      uVar2 = *(undefined2 *)(puVar4 + lVar6 * 2);
      puVar7[lVar6] = (uchar)uVar2;
      puVar8[lVar6] = (uchar)((ushort)uVar2 >> 8);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x280);
    lVar5 = lVar5 + 1;
    puVar8 = puVar8 + 0x280;
    puVar7 = puVar7 + 0x280;
    puVar4 = puVar4 + 0x500;
  } while (lVar5 != 0x1e0);
  cv::Mat::zeros((int)local_190,0x1e0,0x280);
  cv::Mat::Mat(local_1f0);
  (**(code **)(*local_190[0] + 0x18))(local_190[0],local_190,local_1f0,0xffffffff);
  cv::Mat::~Mat(local_c0);
  cv::Mat::~Mat(local_120);
  cv::Mat::~Mat(local_180);
  cv::Mat::zeros((int)local_190,0x1e0,0x280);
  cv::Mat::Mat(local_250);
  (**(code **)(*local_190[0] + 0x18))(local_190[0],local_190,local_250,0xffffffff);
  cv::Mat::~Mat(local_c0);
  cv::Mat::~Mat(local_120);
  cv::Mat::~Mat(local_180);
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      *(uchar *)(lVar6 + *local_1a8 * lVar5 + local_1e0) = left_rect[lVar6];
      *(uchar *)(lVar6 + *local_208 * lVar5 + local_240) = right_rect[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x280);
    lVar5 = lVar5 + 1;
    right_rect = right_rect + 0x280;
    left_rect = left_rect + 0x280;
  } while (lVar5 != 0x1e0);
  CameraBase::saveFrame(&this->super_CameraBase,local_1f0,local_250);
  piVar1 = &(this->super_CameraBase).m_frameCount;
  *piVar1 = *piVar1 + 1;
  cv::Mat::~Mat(local_250);
  cv::Mat::~Mat(local_1f0);
  return;
}

Assistant:

void Intel_V4L2::getLRFrames (unsigned char *left_rect, unsigned char *right_rect) {
    int status = capture_frame ();
    if (0 != status) {
        std::cout << "Error : failed to capture Infrared frame." << std::endl;
        return;
    }
    unsigned short *interlacedBuffer = (unsigned short *) m_pBigBuffer;
    for (int i = 0; i < 480; i++) {
        for (int j = 0; j < 640; j++) {
            unsigned short lr_pixel = interlacedBuffer[i*640+j];
            left_rect[i*640+j]  = lr_pixel % 256;
            right_rect[i*640+j] = lr_pixel / 256;
        }
    }

    #if 1
    cv::Mat leftMat  = cv::Mat::zeros (480, 640, CV_8U);
    cv::Mat rightMat = cv::Mat::zeros (480, 640, CV_8U);

    for (int i = 0; i < 480; i++) {
        for (int j = 0; j < 640; j++) {
            leftMat.at<uchar>(i, j)  = left_rect[i*640+j];
            rightMat.at<uchar>(i, j) = right_rect[i*640+j];
        }
    }

    saveFrame (leftMat, rightMat);

    incrementFrameCount ();
    #endif
}